

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O2

int av1_apply_selfguided_restoration_sse4_1
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  int *piVar1;
  int *piVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [16];
  int iVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  ushort *puVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  ushort *puVar13;
  int32_t *piVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar17 [16];
  short sVar18;
  int iVar19;
  short sVar21;
  short sVar22;
  int iVar23;
  short sVar25;
  short sVar26;
  int iVar27;
  short sVar29;
  short sVar30;
  int iVar31;
  undefined1 auVar20 [16];
  short sVar33;
  int iVar34;
  int iVar36;
  int iVar38;
  int iVar39;
  undefined1 auVar35 [16];
  ushort uVar41;
  undefined1 in_XMM7 [16];
  undefined1 auVar40 [16];
  ushort uVar42;
  undefined1 in_XMM8 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int xq [2];
  int iVar24;
  int iVar28;
  int iVar32;
  uint uVar37;
  
  iVar6 = av1_selfguided_restoration_sse4_1
                    (dat8,width,height,stride,tmpbuf,tmpbuf + 0x27734,width,eps,bit_depth,highbd);
  if (iVar6 == 0) {
    av1_decode_xq(xqd,xq,av1_sgr_params + eps);
    auVar15._4_4_ = xq[1];
    auVar15._0_4_ = xq[1];
    auVar15._8_4_ = xq[1];
    auVar15._12_4_ = xq[1];
    auVar16 = ZEXT416((uint)~(-1 << ((byte)bit_depth & 0x1f)));
    auVar16 = pshuflw(auVar16,auVar16,0);
    uVar10 = 0;
    uVar12 = (ulong)(uint)height;
    if (height < 1) {
      uVar12 = uVar10;
    }
    pauVar7 = (undefined1 (*) [16])((long)dat8 * 2);
    piVar14 = tmpbuf + 0x27738;
    puVar9 = (ushort *)((long)dst8 * 2);
    auVar17 = pmovsxwd(in_XMM4,0x400040004000400);
    for (; uVar10 != uVar12; uVar10 = uVar10 + 1) {
      pauVar11 = pauVar7;
      puVar13 = puVar9;
      for (lVar8 = 0; lVar8 < width; lVar8 = lVar8 + 8) {
        if (highbd == 0) {
          auVar40 = pmovzxbw(in_XMM7,*(undefined8 *)(dat8 + lVar8));
        }
        else {
          auVar40 = *pauVar11;
        }
        auVar40 = psllw(auVar40,4);
        in_XMM8 = pmovzxwd(in_XMM8,auVar40);
        in_XMM7._0_4_ = CONCAT22(0,auVar40._8_2_);
        in_XMM7._4_2_ = auVar40._10_2_;
        in_XMM7._6_2_ = 0;
        uVar41 = auVar40._12_2_;
        in_XMM7._8_2_ = uVar41;
        in_XMM7._10_2_ = 0;
        uVar42 = auVar40._14_2_;
        in_XMM7._12_2_ = uVar42;
        in_XMM7._14_2_ = 0;
        iVar6 = in_XMM8._0_4_;
        iVar19 = iVar6 * 0x80;
        iVar24 = in_XMM8._4_4_;
        iVar23 = iVar24 * 0x80;
        iVar28 = in_XMM8._8_4_;
        iVar32 = in_XMM8._12_4_;
        iVar27 = iVar28 * 0x80;
        iVar31 = iVar32 * 0x80;
        iVar34 = in_XMM7._0_4_ * 0x80;
        uVar37 = (uint)auVar40._10_2_;
        iVar36 = uVar37 * 0x80;
        iVar38 = (uint)uVar41 * 0x80;
        iVar39 = (uint)uVar42 * 0x80;
        if (0 < av1_sgr_params[eps].r[0]) {
          piVar1 = piVar14 + lVar8 + -0x27738;
          piVar2 = piVar14 + lVar8 + -0x27734;
          auVar43._0_4_ = *piVar1 - iVar6;
          auVar43._4_4_ = piVar1[1] - iVar24;
          auVar43._8_4_ = piVar1[2] - iVar28;
          auVar43._12_4_ = piVar1[3] - iVar32;
          auVar40._4_4_ = xq[0];
          auVar40._0_4_ = xq[0];
          auVar40._8_4_ = xq[0];
          auVar40._12_4_ = xq[0];
          auVar40 = pmulld(auVar43,auVar40);
          iVar19 = iVar19 + auVar40._0_4_;
          iVar23 = iVar23 + auVar40._4_4_;
          iVar27 = iVar27 + auVar40._8_4_;
          iVar31 = iVar31 + auVar40._12_4_;
          auVar45._0_4_ = *piVar2 - in_XMM7._0_4_;
          auVar45._4_4_ = piVar2[1] - uVar37;
          auVar45._8_4_ = piVar2[2] - (uint)uVar41;
          auVar45._12_4_ = piVar2[3] - (uint)uVar42;
          auVar5._4_4_ = xq[0];
          auVar5._0_4_ = xq[0];
          auVar5._8_4_ = xq[0];
          auVar5._12_4_ = xq[0];
          auVar40 = pmulld(auVar45,auVar5);
          iVar34 = iVar34 + auVar40._0_4_;
          iVar36 = iVar36 + auVar40._4_4_;
          iVar38 = iVar38 + auVar40._8_4_;
          iVar39 = iVar39 + auVar40._12_4_;
        }
        if (0 < av1_sgr_params[eps].r[1]) {
          piVar2 = piVar14 + lVar8 + -4;
          piVar1 = piVar14 + lVar8;
          auVar44._0_4_ = *piVar2 - iVar6;
          auVar44._4_4_ = piVar2[1] - iVar24;
          auVar44._8_4_ = piVar2[2] - iVar28;
          auVar44._12_4_ = piVar2[3] - iVar32;
          auVar40 = pmulld(auVar44,auVar15);
          iVar19 = iVar19 + auVar40._0_4_;
          iVar23 = iVar23 + auVar40._4_4_;
          iVar27 = iVar27 + auVar40._8_4_;
          iVar31 = iVar31 + auVar40._12_4_;
          auVar46._0_4_ = *piVar1 - in_XMM7._0_4_;
          auVar46._4_4_ = piVar1[1] - uVar37;
          auVar46._8_4_ = piVar1[2] - (uint)uVar41;
          auVar46._12_4_ = piVar1[3] - (uint)uVar42;
          auVar40 = pmulld(auVar46,auVar15);
          iVar34 = iVar34 + auVar40._0_4_;
          iVar36 = iVar36 + auVar40._4_4_;
          iVar38 = iVar38 + auVar40._8_4_;
          iVar39 = iVar39 + auVar40._12_4_;
        }
        auVar20._0_4_ = iVar19 + auVar17._0_4_ >> 0xb;
        auVar20._4_4_ = iVar23 + auVar17._4_4_ >> 0xb;
        auVar20._8_4_ = iVar27 + auVar17._8_4_ >> 0xb;
        auVar20._12_4_ = iVar31 + auVar17._12_4_ >> 0xb;
        auVar35._0_4_ = iVar34 + auVar17._0_4_ >> 0xb;
        auVar35._4_4_ = iVar36 + auVar17._4_4_ >> 0xb;
        auVar35._8_4_ = iVar38 + auVar17._8_4_ >> 0xb;
        auVar35._12_4_ = iVar39 + auVar17._12_4_ >> 0xb;
        if (highbd == 0) {
          auVar40 = packssdw(auVar20,auVar35);
          sVar3 = auVar40._0_2_;
          sVar4 = auVar40._2_2_;
          sVar18 = auVar40._4_2_;
          sVar21 = auVar40._6_2_;
          sVar22 = auVar40._8_2_;
          sVar25 = auVar40._10_2_;
          sVar26 = auVar40._12_2_;
          sVar29 = auVar40._14_2_;
          *(ulong *)(dst8 + lVar8) =
               CONCAT17((0 < sVar29) * (sVar29 < 0x100) * auVar40[0xe] - (0xff < sVar29),
                        CONCAT16((0 < sVar26) * (sVar26 < 0x100) * auVar40[0xc] - (0xff < sVar26),
                                 CONCAT15((0 < sVar25) * (sVar25 < 0x100) * auVar40[10] -
                                          (0xff < sVar25),
                                          CONCAT14((0 < sVar22) * (sVar22 < 0x100) * auVar40[8] -
                                                   (0xff < sVar22),
                                                   CONCAT13((0 < sVar21) * (sVar21 < 0x100) *
                                                            auVar40[6] - (0xff < sVar21),
                                                            CONCAT12((0 < sVar18) * (sVar18 < 0x100)
                                                                     * auVar40[4] - (0xff < sVar18),
                                                                     CONCAT11((0 < sVar4) *
                                                                              (sVar4 < 0x100) *
                                                                              auVar40[2] -
                                                                              (0xff < sVar4),
                                                                              (0 < sVar3) *
                                                                              (sVar3 < 0x100) *
                                                                              auVar40[0] -
                                                                              (0xff < sVar3))))))));
        }
        else {
          auVar40 = packusdw(auVar20,auVar35);
          sVar3 = auVar16._0_2_;
          sVar18 = auVar40._0_2_;
          sVar4 = auVar16._2_2_;
          sVar21 = auVar40._2_2_;
          sVar22 = auVar40._4_2_;
          sVar25 = auVar40._6_2_;
          sVar26 = auVar40._8_2_;
          sVar29 = auVar40._10_2_;
          sVar30 = auVar40._12_2_;
          sVar33 = auVar40._14_2_;
          *puVar13 = (ushort)(sVar3 < sVar18) * sVar3 | (ushort)(sVar3 >= sVar18) * sVar18;
          puVar13[1] = (ushort)(sVar4 < sVar21) * sVar4 | (ushort)(sVar4 >= sVar21) * sVar21;
          puVar13[2] = (ushort)(sVar3 < sVar22) * sVar3 | (ushort)(sVar3 >= sVar22) * sVar22;
          puVar13[3] = (ushort)(sVar4 < sVar25) * sVar4 | (ushort)(sVar4 >= sVar25) * sVar25;
          puVar13[4] = (ushort)(sVar3 < sVar26) * sVar3 | (ushort)(sVar3 >= sVar26) * sVar26;
          puVar13[5] = (ushort)(sVar4 < sVar29) * sVar4 | (ushort)(sVar4 >= sVar29) * sVar29;
          puVar13[6] = (ushort)(sVar3 < sVar30) * sVar3 | (ushort)(sVar3 >= sVar30) * sVar30;
          puVar13[7] = (ushort)(sVar4 < sVar33) * sVar4 | (ushort)(sVar4 >= sVar33) * sVar33;
        }
        pauVar11 = pauVar11 + 1;
        puVar13 = puVar13 + 8;
      }
      dat8 = dat8 + stride;
      pauVar7 = (undefined1 (*) [16])(*pauVar7 + (long)stride * 2);
      piVar14 = piVar14 + width;
      puVar9 = puVar9 + dst_stride;
      dst8 = dst8 + dst_stride;
    }
    iVar6 = 0;
  }
  else {
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

int av1_apply_selfguided_restoration_sse4_1(const uint8_t *dat8, int width,
                                            int height, int stride, int eps,
                                            const int *xqd, uint8_t *dst8,
                                            int dst_stride, int32_t *tmpbuf,
                                            int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);
  const int ret = av1_selfguided_restoration_sse4_1(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);

  __m128i xq0 = _mm_set1_epi32(xq[0]);
  __m128i xq1 = _mm_set1_epi32(xq[1]);

  for (int i = 0; i < height; ++i) {
    // Calculate output in batches of 8 pixels
    for (int j = 0; j < width; j += 8) {
      const int k = i * width + j;
      const int m = i * dst_stride + j;

      const uint8_t *dat8ij = dat8 + i * stride + j;
      __m128i src;
      if (highbd) {
        src = xx_loadu_128(CONVERT_TO_SHORTPTR(dat8ij));
      } else {
        src = _mm_cvtepu8_epi16(xx_loadl_64(dat8ij));
      }

      const __m128i u = _mm_slli_epi16(src, SGRPROJ_RST_BITS);
      const __m128i u_0 = _mm_cvtepu16_epi32(u);
      const __m128i u_1 = _mm_cvtepu16_epi32(_mm_srli_si128(u, 8));

      __m128i v_0 = _mm_slli_epi32(u_0, SGRPROJ_PRJ_BITS);
      __m128i v_1 = _mm_slli_epi32(u_1, SGRPROJ_PRJ_BITS);

      if (params->r[0] > 0) {
        const __m128i f1_0 = _mm_sub_epi32(xx_loadu_128(&flt0[k]), u_0);
        v_0 = _mm_add_epi32(v_0, _mm_mullo_epi32(xq0, f1_0));

        const __m128i f1_1 = _mm_sub_epi32(xx_loadu_128(&flt0[k + 4]), u_1);
        v_1 = _mm_add_epi32(v_1, _mm_mullo_epi32(xq0, f1_1));
      }

      if (params->r[1] > 0) {
        const __m128i f2_0 = _mm_sub_epi32(xx_loadu_128(&flt1[k]), u_0);
        v_0 = _mm_add_epi32(v_0, _mm_mullo_epi32(xq1, f2_0));

        const __m128i f2_1 = _mm_sub_epi32(xx_loadu_128(&flt1[k + 4]), u_1);
        v_1 = _mm_add_epi32(v_1, _mm_mullo_epi32(xq1, f2_1));
      }

      const __m128i rounding =
          round_for_shift(SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m128i w_0 = _mm_srai_epi32(_mm_add_epi32(v_0, rounding),
                                         SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m128i w_1 = _mm_srai_epi32(_mm_add_epi32(v_1, rounding),
                                         SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      if (highbd) {
        // Pack into 16 bits and clamp to [0, 2^bit_depth)
        const __m128i tmp = _mm_packus_epi32(w_0, w_1);
        const __m128i max = _mm_set1_epi16((1 << bit_depth) - 1);
        const __m128i res = _mm_min_epi16(tmp, max);
        xx_storeu_128(CONVERT_TO_SHORTPTR(dst8 + m), res);
      } else {
        // Pack into 8 bits and clamp to [0, 256)
        const __m128i tmp = _mm_packs_epi32(w_0, w_1);
        const __m128i res = _mm_packus_epi16(tmp, tmp /* "don't care" value */);
        xx_storel_64(dst8 + m, res);
      }
    }
  }
  return 0;
}